

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetType.cpp
# Opt level: O0

NetType * slang::ast::NetType::fromSyntax(Scope *scope,NetTypeDeclarationSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceLocation scope_00;
  __extent_storage<18446744073709551615UL> this;
  DataTypeSyntax *newType;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  string_view sVar1;
  NetType *result;
  Compilation *comp;
  Token *in_stack_ffffffffffffffb0;
  DeclaredType *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  BumpAllocator *in_stack_ffffffffffffffc0;
  Symbol *this_01;
  pointer ppAVar2;
  
  Scope::getCompilation(in_RDI);
  sVar1 = parsing::Token::valueText(in_stack_ffffffffffffffb0);
  this_01 = (Symbol *)sVar1._M_len;
  ppAVar2 = (pointer)sVar1._M_str;
  scope_00 = parsing::Token::location((Token *)&in_RSI[4].parent);
  this._M_extent_value =
       (size_t)BumpAllocator::
               emplace<slang::ast::NetType,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          (SourceLocation *)in_stack_ffffffffffffffb0);
  Symbol::setSyntax((Symbol *)this._M_extent_value,in_RSI);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffffb0,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDI)
  ;
  syntax_00._M_extent._M_extent_value = this._M_extent_value;
  syntax_00._M_ptr = ppAVar2;
  Symbol::setAttributes(this_01,(Scope *)scope_00,syntax_00);
  this_00 = &((NetType *)this._M_extent_value)->declaredType;
  newType = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                      ((not_null<slang::syntax::DataTypeSyntax_*> *)0x4e1a14);
  DeclaredType::setTypeSyntax(this_00,newType);
  return (NetType *)this._M_extent_value;
}

Assistant:

NetType& NetType::fromSyntax(const Scope& scope, const NetTypeDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<NetType>(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->declaredType.setTypeSyntax(*syntax.type);

    return *result;
}